

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrSpatialAnchorsCreateInfoFromUuidsML *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  code *pcVar1;
  void *value_00;
  long lVar2;
  XrUuidEXT *pXVar3;
  XrSpatialAnchorsCreateInfoFromUuidsML *pXVar4;
  bool bVar5;
  XrInstance pXVar6;
  ostream *poVar7;
  invalid_argument *piVar8;
  allocator local_6e9;
  string local_6e8 [32];
  string local_6c8 [32];
  __cxx11 local_6a8 [32];
  string local_688 [8];
  string uuids_array_prefix;
  uint local_664;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660 [4];
  uint32_t value_uuids_inc;
  ostringstream local_640 [8];
  ostringstream oss_uuids_array;
  string local_4c8 [8];
  string uuids_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8 [32];
  ostringstream local_488 [8];
  ostringstream oss_uuidCount;
  string local_310 [8];
  string uuidcount_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0 [32];
  ostringstream local_2d0 [8];
  ostringstream oss_storage;
  string local_158 [8];
  string storage_prefix;
  string local_138 [32];
  string local_118 [8];
  string next_prefix;
  __cxx11 local_f8 [32];
  char acStack_d8 [8];
  char type_string_1 [64];
  string local_90 [8];
  string type_prefix;
  XrSpatialAnchorsCreateInfoFromUuidsML local_60;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *contents_local;
  string *psStack_30;
  bool is_pointer_local;
  string *type_string_local;
  string *prefix_local;
  XrSpatialAnchorsCreateInfoFromUuidsML *value_local;
  XrGeneratedDispatchTable *gen_dispatch_table_local;
  
  local_60.uuids = (XrUuidEXT *)contents;
  contents_local._7_1_ = is_pointer;
  psStack_30 = type_string;
  type_string_local = prefix;
  prefix_local = (string *)value;
  value_local = (XrSpatialAnchorsCreateInfoFromUuidsML *)gen_dispatch_table;
  PointerToHexString<XrSpatialAnchorsCreateInfoFromUuidsML>(&local_60);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if ((contents_local._7_1_ & 1) == 0) {
    std::__cxx11::string::operator+=((string *)prefix,".");
  }
  else {
    std::__cxx11::string::operator+=((string *)prefix,"->");
  }
  std::__cxx11::string::string(local_90,(string *)prefix);
  std::__cxx11::string::operator+=(local_90,"type");
  pXVar3 = local_60.uuids;
  if (value_local == (XrSpatialAnchorsCreateInfoFromUuidsML *)0x0) {
    std::__cxx11::to_string(local_f8,*(int *)prefix_local);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)pXVar3,(char (*) [16])"XrStructureType",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
  }
  else {
    type_string_1[0x28] = '\0';
    type_string_1[0x29] = '\0';
    type_string_1[0x2a] = '\0';
    type_string_1[0x2b] = '\0';
    type_string_1[0x2c] = '\0';
    type_string_1[0x2d] = '\0';
    type_string_1[0x2e] = '\0';
    type_string_1[0x2f] = '\0';
    type_string_1[0x30] = '\0';
    type_string_1[0x31] = '\0';
    type_string_1[0x32] = '\0';
    type_string_1[0x33] = '\0';
    type_string_1[0x34] = '\0';
    type_string_1[0x35] = '\0';
    type_string_1[0x36] = '\0';
    type_string_1[0x37] = '\0';
    type_string_1[0x18] = '\0';
    type_string_1[0x19] = '\0';
    type_string_1[0x1a] = '\0';
    type_string_1[0x1b] = '\0';
    type_string_1[0x1c] = '\0';
    type_string_1[0x1d] = '\0';
    type_string_1[0x1e] = '\0';
    type_string_1[0x1f] = '\0';
    type_string_1[0x20] = '\0';
    type_string_1[0x21] = '\0';
    type_string_1[0x22] = '\0';
    type_string_1[0x23] = '\0';
    type_string_1[0x24] = '\0';
    type_string_1[0x25] = '\0';
    type_string_1[0x26] = '\0';
    type_string_1[0x27] = '\0';
    type_string_1[8] = '\0';
    type_string_1[9] = '\0';
    type_string_1[10] = '\0';
    type_string_1[0xb] = '\0';
    type_string_1[0xc] = '\0';
    type_string_1[0xd] = '\0';
    type_string_1[0xe] = '\0';
    type_string_1[0xf] = '\0';
    type_string_1[0x10] = '\0';
    type_string_1[0x11] = '\0';
    type_string_1[0x12] = '\0';
    type_string_1[0x13] = '\0';
    type_string_1[0x14] = '\0';
    type_string_1[0x15] = '\0';
    type_string_1[0x16] = '\0';
    type_string_1[0x17] = '\0';
    acStack_d8[0] = '\0';
    acStack_d8[1] = '\0';
    acStack_d8[2] = '\0';
    acStack_d8[3] = '\0';
    acStack_d8[4] = '\0';
    acStack_d8[5] = '\0';
    acStack_d8[6] = '\0';
    acStack_d8[7] = '\0';
    type_string_1[0] = '\0';
    type_string_1[1] = '\0';
    type_string_1[2] = '\0';
    type_string_1[3] = '\0';
    type_string_1[4] = '\0';
    type_string_1[5] = '\0';
    type_string_1[6] = '\0';
    type_string_1[7] = '\0';
    pcVar1 = *(code **)&value_local[1].uuidCount;
    pXVar6 = FindInstanceFromDispatchTable((XrGeneratedDispatchTable *)value_local);
    (*pcVar1)(pXVar6,*(undefined4 *)prefix_local,acStack_d8);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)local_60.uuids,(char (*) [16])"XrStructureType",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
               (char (*) [64])acStack_d8);
  }
  std::__cxx11::string::string(local_118,(string *)prefix);
  std::__cxx11::string::operator+=(local_118,"next");
  pXVar4 = value_local;
  value_00 = *(void **)(prefix_local + 8);
  std::__cxx11::string::string(local_138,local_118);
  bVar5 = ApiDumpDecodeNextChain
                    ((XrGeneratedDispatchTable *)pXVar4,value_00,(string *)local_138,
                     (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_60.uuids);
  std::__cxx11::string::~string(local_138);
  if (((bVar5 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::string(local_158,(string *)prefix);
    std::__cxx11::string::operator+=(local_158,"storage");
    std::__cxx11::ostringstream::ostringstream(local_2d0);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_2d0,std::hex);
    std::ostream::operator<<(poVar7,*(void **)(prefix_local + 0x10));
    pXVar3 = local_60.uuids;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[26],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)pXVar3,(char (*) [26])"XrSpatialAnchorsStorageML",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
               local_2f0);
    std::__cxx11::string::~string((string *)local_2f0);
    std::__cxx11::string::string(local_310,(string *)prefix);
    std::__cxx11::string::operator+=(local_310,"uuidCount");
    std::__cxx11::ostringstream::ostringstream(local_488);
    poVar7 = std::operator<<((ostream *)local_488,"0x");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::hex);
    std::ostream::operator<<(poVar7,*(uint *)(prefix_local + 0x18));
    pXVar3 = local_60.uuids;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)pXVar3,(char (*) [9])"uint32_t",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310,
               local_4a8);
    std::__cxx11::string::~string((string *)local_4a8);
    std::__cxx11::string::string(local_4c8,(string *)prefix);
    std::__cxx11::string::operator+=(local_4c8,"uuids");
    std::__cxx11::ostringstream::ostringstream(local_640);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_640,std::hex);
    std::ostream::operator<<(poVar7,*(void **)(prefix_local + 0x20));
    pXVar3 = local_60.uuids;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[17],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)pXVar3,(char (*) [17])"const XrUuidEXT*",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c8,
               local_660);
    std::__cxx11::string::~string((string *)local_660);
    local_664 = 0;
    while( true ) {
      if (*(uint *)(prefix_local + 0x18) <= local_664) {
        gen_dispatch_table_local._7_1_ = 1;
        std::__cxx11::ostringstream::~ostringstream(local_640);
        std::__cxx11::string::~string(local_4c8);
        std::__cxx11::ostringstream::~ostringstream(local_488);
        std::__cxx11::string::~string(local_310);
        std::__cxx11::ostringstream::~ostringstream(local_2d0);
        std::__cxx11::string::~string(local_158);
        std::__cxx11::string::~string(local_118);
        std::__cxx11::string::~string(local_90);
        return (bool)(gen_dispatch_table_local._7_1_ & 1);
      }
      std::__cxx11::string::string(local_688,local_4c8);
      std::__cxx11::string::operator+=(local_688,"[");
      std::__cxx11::to_string(local_6a8,local_664);
      std::__cxx11::string::operator+=(local_688,(string *)local_6a8);
      std::__cxx11::string::~string((string *)local_6a8);
      std::__cxx11::string::operator+=(local_688,"]");
      pXVar4 = value_local;
      lVar2 = *(long *)(prefix_local + 0x20);
      std::__cxx11::string::string(local_6c8,local_688);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6e8,"const XrUuidEXT*",&local_6e9);
      bVar5 = ApiDumpOutputXrStruct
                        ((XrGeneratedDispatchTable *)pXVar4,
                         (XrUuid *)(lVar2 + (ulong)local_664 * 0x10),(string *)local_6c8,
                         (string *)local_6e8,false,
                         (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_60.uuids);
      std::__cxx11::string::~string(local_6e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
      std::__cxx11::string::~string(local_6c8);
      if (((bVar5 ^ 0xffU) & 1) != 0) break;
      std::__cxx11::string::~string(local_688);
      local_664 = local_664 + 1;
    }
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar8,"Invalid Operation");
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar8,"Invalid Operation");
  __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSpatialAnchorsCreateInfoFromUuidsML* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string storage_prefix = prefix;
        storage_prefix += "storage";
        std::ostringstream oss_storage;
        oss_storage << std::hex << reinterpret_cast<const void*>(value->storage);
        contents.emplace_back("XrSpatialAnchorsStorageML", storage_prefix, oss_storage.str());
        std::string uuidcount_prefix = prefix;
        uuidcount_prefix += "uuidCount";
        std::ostringstream oss_uuidCount;
        oss_uuidCount << "0x" << std::hex << (value->uuidCount);
        contents.emplace_back("uint32_t", uuidcount_prefix, oss_uuidCount.str());
        std::string uuids_prefix = prefix;
        uuids_prefix += "uuids";
        std::ostringstream oss_uuids_array;
        oss_uuids_array << std::hex << reinterpret_cast<const void*>(value->uuids);
        contents.emplace_back("const XrUuidEXT*", uuids_prefix, oss_uuids_array.str());
        for (uint32_t value_uuids_inc = 0; value_uuids_inc < value->uuidCount; ++value_uuids_inc) {
            std::string uuids_array_prefix = uuids_prefix;
            uuids_array_prefix += "[";
            uuids_array_prefix += std::to_string(value_uuids_inc);
            uuids_array_prefix += "]";
            if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->uuids[value_uuids_inc], uuids_array_prefix, "const XrUuidEXT*", false, contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
        }
        return true;
    } catch(...) {
    }
    return false;
}